

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

bool parse_line_json<true>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  uint64_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  parser *ppVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  example *local_78;
  DecisionServiceInteraction interaction;
  
  if (all->p->decision_service_json == true) {
    if (*line == '{') {
      paVar2 = &interaction.eventId.field_2;
      interaction.eventId._M_string_length = 0;
      interaction.eventId.field_2._M_local_buf[0] = '\0';
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      interaction.probabilityOfDrop = 0.0;
      interaction.skipLearn = false;
      interaction.eventId._M_dataplus._M_p = (pointer)paVar2;
      VW::read_line_decision_service_json<true>
                (all,examples,line,num_chars,false,VW::get_unused_example,all,&interaction);
      puVar5 = interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar4 = interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar6 = interaction.skipLearn != true;
      if (!bVar6) {
        VW::return_multiple_example(all,examples);
        ppVar3 = all->p;
        local_78 = VW::object_pool<example,_example_initializer>::get_object(&ppVar3->example_pool);
        local_78->in_use = true;
        puVar1 = &ppVar3->begin_parsed_examples;
        *puVar1 = *puVar1 + 1;
        v_array<example_*>::push_back(examples,&local_78);
      }
      if (interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(interaction.actions.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)interaction.eventId._M_dataplus._M_p != paVar2) {
        operator_delete(interaction.eventId._M_dataplus._M_p);
      }
      if (bVar6 && puVar5 != puVar4) goto LAB_001b3078;
    }
    bVar6 = false;
  }
  else {
    VW::read_line_json<true>(all,examples,line,VW::get_unused_example,all);
LAB_001b3078:
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool parse_line_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  if (all->p->decision_service_json)
  {
    // Skip lines that do not start with "{"
    if (line[0] != '{')
    {
      return false;
    }

    DecisionServiceInteraction interaction;
    VW::template read_line_decision_service_json<audit>(*all, examples, line, num_chars, false,
        reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all, &interaction);

    // TODO: In refactoring the parser to be usable standalone, we need to ensure that we
    // stop suppressing "skipLearn" interactions. Also, not sure if this is the right logic
    // for counterfactual. (@marco)
    if (interaction.skipLearn)
    {
      VW::return_multiple_example(*all, examples);
      examples.push_back(&VW::get_unused_example(all));
      return false;
    }

    // let's ask to continue reading data until we find a line with actions provided
    if (interaction.actions.size() == 0)
    {
      //VW::return_multiple_example(*all, examples);
      //examples.push_back(&VW::get_unused_example(all));
      return false;
    }
  }
  else
    VW::template read_line_json<audit>(
        *all, examples, line, reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all);

  return true;
}